

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void ge_storage_cmov_test(void)

{
  int iVar1;
  secp256k1_ge_storage a;
  secp256k1_ge_storage r;
  secp256k1_ge_storage *in_stack_ffffffffffffff78;
  secp256k1_ge_storage *in_stack_ffffffffffffff80;
  undefined1 local_40 [64];
  
  memset(local_40,0xff,0x40);
  memset(&stack0xffffffffffffff80,0,0x40);
  secp256k1_ge_storage_cmov(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,0);
  iVar1 = secp256k1_memcmp_var(local_40,&ge_storage_cmov_test::max,0x40);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1dab,"test condition failed: secp256k1_memcmp_var(&r, &max, sizeof(r)) == 0");
    abort();
  }
  memcpy(local_40,&ge_storage_cmov_test::zero,0x40);
  memcpy(&stack0xffffffffffffff80,&ge_storage_cmov_test::max,0x40);
  secp256k1_ge_storage_cmov(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,0);
  iVar1 = secp256k1_memcmp_var(local_40,&ge_storage_cmov_test::max,0x40);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1daf,"test condition failed: secp256k1_memcmp_var(&r, &max, sizeof(r)) == 0");
    abort();
  }
  memcpy(&stack0xffffffffffffff80,&ge_storage_cmov_test::zero,0x40);
  secp256k1_ge_storage_cmov(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,0);
  iVar1 = secp256k1_memcmp_var(local_40,&ge_storage_cmov_test::zero,0x40);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1db3,"test condition failed: secp256k1_memcmp_var(&r, &zero, sizeof(r)) == 0");
    abort();
  }
  memcpy(&stack0xffffffffffffff80,&ge_storage_cmov_test::one,0x40);
  secp256k1_ge_storage_cmov(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,0);
  iVar1 = secp256k1_memcmp_var(local_40,&ge_storage_cmov_test::one,0x40);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1db7,"test condition failed: secp256k1_memcmp_var(&r, &one, sizeof(r)) == 0");
    abort();
  }
  memcpy(local_40,&ge_storage_cmov_test::one,0x40);
  memcpy(&stack0xffffffffffffff80,&ge_storage_cmov_test::zero,0x40);
  secp256k1_ge_storage_cmov(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,0);
  iVar1 = secp256k1_memcmp_var(local_40,&ge_storage_cmov_test::one,0x40);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1dbb,"test condition failed: secp256k1_memcmp_var(&r, &one, sizeof(r)) == 0");
    abort();
  }
  return;
}

Assistant:

static void ge_storage_cmov_test(void) {
    static const secp256k1_ge_storage zero = SECP256K1_GE_STORAGE_CONST(0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0);
    static const secp256k1_ge_storage one = SECP256K1_GE_STORAGE_CONST(0, 0, 0, 0, 0, 0, 0, 1, 0, 0, 0, 0, 0, 0, 0, 1);
    static const secp256k1_ge_storage max = SECP256K1_GE_STORAGE_CONST(
        0xFFFFFFFFUL, 0xFFFFFFFFUL, 0xFFFFFFFFUL, 0xFFFFFFFFUL,
        0xFFFFFFFFUL, 0xFFFFFFFFUL, 0xFFFFFFFFUL, 0xFFFFFFFFUL,
        0xFFFFFFFFUL, 0xFFFFFFFFUL, 0xFFFFFFFFUL, 0xFFFFFFFFUL,
        0xFFFFFFFFUL, 0xFFFFFFFFUL, 0xFFFFFFFFUL, 0xFFFFFFFFUL
    );
    secp256k1_ge_storage r = max;
    secp256k1_ge_storage a = zero;

    secp256k1_ge_storage_cmov(&r, &a, 0);
    CHECK(secp256k1_memcmp_var(&r, &max, sizeof(r)) == 0);

    r = zero; a = max;
    secp256k1_ge_storage_cmov(&r, &a, 1);
    CHECK(secp256k1_memcmp_var(&r, &max, sizeof(r)) == 0);

    a = zero;
    secp256k1_ge_storage_cmov(&r, &a, 1);
    CHECK(secp256k1_memcmp_var(&r, &zero, sizeof(r)) == 0);

    a = one;
    secp256k1_ge_storage_cmov(&r, &a, 1);
    CHECK(secp256k1_memcmp_var(&r, &one, sizeof(r)) == 0);

    r = one; a = zero;
    secp256k1_ge_storage_cmov(&r, &a, 0);
    CHECK(secp256k1_memcmp_var(&r, &one, sizeof(r)) == 0);
}